

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<google::protobuf::Map<bool,proto2_unittest::Proto2MapEnum>>
               (Map<bool,_proto2_unittest::Proto2MapEnum> *value,ostream *os)

{
  ostream *os_local;
  Map<bool,_proto2_unittest::Proto2MapEnum> *value_local;
  
  ContainerPrinter::PrintValue<google::protobuf::Map<bool,proto2_unittest::Proto2MapEnum>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}